

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

uint8 * google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                  (int field_number,int32 value,uint8 *target)

{
  uint8 *puVar1;
  
  puVar1 = io::CodedOutputStream::WriteVarint32ToArray(field_number << 3,target);
  puVar1 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(value,puVar1);
  return puVar1;
}

Assistant:

inline uint8* WireFormatLite::WriteInt32ToArray(int field_number,
                                                int32 value,
                                                uint8* target) {
  target = WriteTagToArray(field_number, WIRETYPE_VARINT, target);
  return WriteInt32NoTagToArray(value, target);
}